

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void sgai_zero_diagonal_block
               (Integer g_a,void *ptr,Integer *lo,Integer *hi,Integer ld,Integer offset,Integer type
               )

{
  long *in_RCX;
  long *in_RDX;
  long in_RSI;
  long in_R8;
  long in_R9;
  undefined8 in_stack_00000008;
  SingleComplex *fca;
  DoubleComplex *dca;
  long *la;
  double *da;
  float *fa;
  int *ia;
  Integer i;
  Integer in_stack_00000128;
  char *in_stack_00000130;
  undefined4 *local_68;
  undefined8 *local_60;
  undefined8 *local_58;
  undefined8 *local_50;
  undefined4 *local_48;
  undefined4 *local_40;
  long local_38;
  
  switch(in_stack_00000008) {
  case 0x3e9:
    local_40 = (undefined4 *)(in_RSI + in_R9 * 4);
    for (local_38 = 0; local_38 < (*in_RCX - *in_RDX) + 1; local_38 = local_38 + 1) {
      *local_40 = 0;
      local_40 = local_40 + in_R8 + 1;
    }
    break;
  case 0x3ea:
    local_58 = (undefined8 *)(in_RSI + in_R9 * 8);
    for (local_38 = 0; local_38 < (*in_RCX - *in_RDX) + 1; local_38 = local_38 + 1) {
      *local_58 = 0;
      local_58 = local_58 + in_R8 + 1;
    }
    break;
  case 0x3eb:
    local_48 = (undefined4 *)(in_RSI + in_R9 * 4);
    for (local_38 = 0; local_38 < (*in_RCX - *in_RDX) + 1; local_38 = local_38 + 1) {
      *local_48 = 0;
      local_48 = local_48 + in_R8 + 1;
    }
    break;
  case 0x3ec:
    local_50 = (undefined8 *)(in_RSI + in_R9 * 8);
    for (local_38 = 0; local_38 < (*in_RCX - *in_RDX) + 1; local_38 = local_38 + 1) {
      *local_50 = 0;
      local_50 = local_50 + in_R8 + 1;
    }
    break;
  default:
    pnga_error(in_stack_00000130,in_stack_00000128);
    break;
  case 0x3ee:
    local_68 = (undefined4 *)(in_RSI + in_R9 * 8);
    for (local_38 = 0; local_38 < (*in_RCX - *in_RDX) + 1; local_38 = local_38 + 1) {
      *local_68 = 0;
      local_68[1] = 0;
      local_68 = local_68 + (in_R8 + 1) * 2;
    }
    break;
  case 0x3ef:
    local_60 = (undefined8 *)(in_RSI + in_R9 * 0x10);
    for (local_38 = 0; local_38 < (*in_RCX - *in_RDX) + 1; local_38 = local_38 + 1) {
      *local_60 = 0;
      local_60[1] = 0;
      local_60 = local_60 + (in_R8 + 1) * 2;
    }
  }
  return;
}

Assistant:

static void sgai_zero_diagonal_block(Integer g_a, void *ptr, Integer *lo, Integer *hi,
                             Integer ld, Integer offset, Integer type)
{
  Integer i;
  int *ia;
  float *fa;
  double *da;
  long *la;
  DoubleComplex *dca;
  SingleComplex *fca;

  switch (type) {
    case C_INT:
      ia = (int *) ptr + offset;
      for (i = 0; i < hi[0] - lo[0] + 1; i++) {
        *ia = 0;
        ia += ld + 1;
      }
      break;
    case C_LONG:
      la = (long *) ptr + offset;
      for (i = 0; i < hi[0] - lo[0] + 1; i++) {
        *la = 0;
        la += ld + 1;
      }
      break;
    case C_FLOAT:
      fa = (float *) ptr + offset;
      for (i = 0; i < hi[0] - lo[0] + 1; i++) {
        *fa = 0.0;
        fa += ld + 1;
      }
      break;
    case C_DBL:
      da = (double *) ptr + offset;
      for (i = 0; i < hi[0] - lo[0] + 1; i++) {
        *da = 0.0;
        da += ld + 1;
      }
      break;
    case C_DCPL:
      dca = (DoubleComplex *) ptr + offset;
      for (i = 0; i < hi[0] - lo[0] + 1; i++) {
        (*dca).real = 0.0;
        (*dca).imag = 0.0;
        dca += ld + 1;
      }
      break;
    case C_SCPL:
      fca = (SingleComplex *) ptr + offset;
      for (i = 0; i < hi[0] - lo[0] + 1; i++) {
        (*fca).real = 0.0;
        (*fca).imag = 0.0;
        fca += ld + 1;
      }
      break;
    default:
      pnga_error("set_diagonal_zero: wrong data type:", type);
  }
}